

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rosout_appender.cpp
# Opt level: O1

void __thiscall miniros::ROSOutAppender::~ROSOutAppender(ROSOutAppender *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar1;
  int iVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  (this->super_LogAppender)._vptr_LogAppender = (_func_int **)&PTR__ROSOutAppender_002ac310;
  this->shutting_down_ = true;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->queue_mutex_);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  std::condition_variable::notify_all();
  pthread_mutex_unlock((pthread_mutex_t *)&this->queue_mutex_);
  std::thread::join();
  this_00 = (this->topic_manager_).
            super___shared_ptr<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((this->publish_thread_)._M_id._M_thread == 0) {
    std::condition_variable::~condition_variable(&this->queue_condition_);
    std::
    vector<std::shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>_>,_std::allocator<std::shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>_>_>_>
    ::~vector(&this->log_queue_);
    pcVar1 = (this->last_error_)._M_dataplus._M_p;
    paVar3 = &(this->last_error_).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != paVar3) {
      operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
      return;
    }
    return;
  }
  std::terminate();
}

Assistant:

ROSOutAppender::~ROSOutAppender()
{
  shutting_down_ = true;

  {
    std::scoped_lock<std::mutex> lock(queue_mutex_);
    queue_condition_.notify_all();
  }

  publish_thread_.join();
}